

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O3

void duckdb::FSSTStorage::StringFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  bitpacking_width_t width;
  uint uVar1;
  uint uVar2;
  idx_t iVar3;
  data_ptr_t pdVar4;
  ColumnSegment *segment_00;
  u32 uVar5;
  BufferManager *pBVar6;
  unsigned_long uVar7;
  type puVar8;
  VectorStringBuffer *str_buffer;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  fsst_compression_header_t *header_ptr;
  data_ptr_t pdVar13;
  char *compressed_string_00;
  string_t sVar14;
  anon_union_16_2_67f50693_for_value aVar15;
  string_t compressed_string;
  BufferHandle handle;
  duckdb_fsst_decoder_t decoder;
  _Head_base<0UL,_unsigned_int_*,_false> local_9a0;
  _Head_base<0UL,_unsigned_int_*,_false> local_998;
  Vector *local_990;
  idx_t local_988;
  data_ptr_t local_980;
  ColumnSegment *local_978;
  data_ptr_t local_970;
  uint local_968;
  undefined4 local_964;
  char *local_960;
  BufferHandle local_958;
  undefined4 local_940;
  undefined4 uStack_93c;
  undefined4 local_938;
  duckdb_fsst_decoder_t local_930;
  
  local_988 = result_idx;
  pBVar6 = BufferManager::GetBufferManager(segment->db);
  (*pBVar6->_vptr_BufferManager[7])(&local_958,pBVar6,&segment->block);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_958.node);
  pdVar13 = (local_958.node.ptr)->buffer;
  iVar3 = segment->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_958.node);
  uVar1 = *(uint *)((local_958.node.ptr)->buffer + segment->offset + 4);
  width = pdVar13[iVar3 + 8];
  local_978 = segment;
  local_970 = pdVar13;
  uVar5 = duckdb_fsst_import(&local_930,pdVar13 + *(uint *)(pdVar13 + iVar3 + 0xc) + iVar3);
  pdVar4 = result->data;
  if (uVar5 == 0) {
    pdVar4 = pdVar4 + local_988 * 0x10;
    pdVar4[0] = '\0';
    pdVar4[1] = '\0';
    pdVar4[2] = '\0';
    pdVar4[3] = '\0';
    pdVar4[4] = '\0';
    pdVar4[5] = '\0';
    pdVar4[6] = '\0';
    pdVar4[7] = '\0';
    pdVar4[8] = '\0';
    pdVar4[9] = '\0';
    pdVar4[10] = '\0';
    pdVar4[0xb] = '\0';
    pdVar4[0xc] = '\0';
    pdVar4[0xd] = '\0';
    pdVar4[0xe] = '\0';
    pdVar4[0xf] = '\0';
  }
  else {
    uVar12 = row_id + 1;
    uVar11 = uVar12;
    local_990 = result;
    local_980 = pdVar4;
    if ((uVar12 & 0x1f) != 0) {
      uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar12 & 0x1f);
      uVar11 = (row_id - uVar7) + 0x21;
    }
    local_9a0._M_head_impl = (uint *)operator_new__(-(ulong)(uVar11 >> 0x3e != 0) | uVar11 * 4);
    BitUnpackRange(local_970 + iVar3 + 0x10,(data_ptr_t)local_9a0._M_head_impl,uVar11,0,width);
    uVar11 = 0xffffffffffffffff;
    if (uVar12 < 0x4000000000000000) {
      uVar11 = uVar12 * 4;
    }
    local_998._M_head_impl = (uint *)operator_new__(uVar11);
    segment_00 = local_978;
    *local_998._M_head_impl = *local_9a0._M_head_impl;
    if (1 < uVar12) {
      uVar9 = *local_998._M_head_impl;
      lVar10 = 0;
      do {
        uVar9 = uVar9 + (local_9a0._M_head_impl + 1)[lVar10];
        (local_998._M_head_impl + 1)[lVar10] = uVar9;
        lVar10 = lVar10 + 1;
      } while (row_id != lVar10);
    }
    puVar8 = unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true>::operator[]
                       ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true> *)
                        &local_9a0,row_id);
    uVar9 = *puVar8;
    uVar12 = CONCAT44(0,uVar9);
    puVar8 = unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true>::operator[]
                       ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true> *)
                        &local_998,row_id);
    uVar2 = *puVar8;
    lVar10 = uVar1 + iVar3;
    if ((long)(int)uVar2 < 0) {
      aVar15.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           UncompressedStringStorage::ReadOverflowString
                     (segment_00,local_990,*(block_id_t *)(pdVar13 + (lVar10 - (ulong)-uVar2)),
                      (int32_t)*(block_id_t *)((long)(pdVar13 + (lVar10 - (ulong)-uVar2)) + 8));
      local_964 = aVar15._4_4_;
    }
    else {
      pdVar13 = pdVar13 + (lVar10 - (int)uVar2);
      aVar15.pointer.ptr = (char *)pdVar13;
      aVar15._0_8_ = uVar12;
      if (uVar9 < 0xd) {
        local_938 = 0;
        local_940 = 0;
        uStack_93c = 0;
        if (uVar9 == 0) {
          local_964 = 0;
          aVar15 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
        }
        else {
          switchD_00b03519::default(&local_940,pdVar13,uVar12);
          aVar15._12_4_ = local_938;
          aVar15._8_4_ = uStack_93c;
          local_964 = local_940;
        }
      }
      else {
        local_964 = *(undefined4 *)pdVar13;
      }
    }
    local_968 = aVar15.pointer.length;
    local_960 = aVar15.pointer.ptr;
    str_buffer = StringVector::GetStringBuffer(local_990);
    compressed_string_00 = aVar15.pointer.ptr;
    if (aVar15.pointer.length < 0xd) {
      compressed_string_00 = (char *)&local_964;
    }
    sVar14 = FSSTPrimitives::DecompressValue
                       (&local_930,str_buffer,compressed_string_00,aVar15._0_8_ & 0xffffffff);
    *(long *)(local_980 + local_988 * 0x10) = sVar14.value._0_8_;
    *(long *)(local_980 + local_988 * 0x10 + 8) = sVar14.value._8_8_;
    if (local_998._M_head_impl != (uint *)0x0) {
      operator_delete__(local_998._M_head_impl);
    }
    if (local_9a0._M_head_impl != (uint *)0x0) {
      operator_delete__(local_9a0._M_head_impl);
    }
  }
  BufferHandle::~BufferHandle(&local_958);
  return;
}

Assistant:

void FSSTStorage::StringFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                                 idx_t result_idx) {

	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	auto base_ptr = handle.Ptr() + segment.GetBlockOffset();
	auto base_data = data_ptr_cast(base_ptr + sizeof(fsst_compression_header_t));
	auto dict = GetDictionary(segment, handle);

	duckdb_fsst_decoder_t decoder;
	bitpacking_width_t width;
	auto have_symbol_table = ParseFSSTSegmentHeader(base_ptr, &decoder, &width);

	auto result_data = FlatVector::GetData<string_t>(result);
	if (!have_symbol_table) {
		// There is no FSST symtable. This is only the case for empty strings or NULLs. We emit an empty string.
		result_data[result_idx] = string_t(nullptr, 0);
		return;
	}

	// We basically just do a scan of 1 which is kinda expensive as we need to repeatedly delta decode until we
	// reach the row we want, we could consider a more clever caching trick if this is slow
	auto offsets = CalculateBpDeltaOffsets(-1, UnsafeNumericCast<idx_t>(row_id), 1);

	auto bitunpack_buffer = unique_ptr<uint32_t[]>(new uint32_t[offsets.total_bitunpack_count]);
	BitUnpackRange(base_data, data_ptr_cast(bitunpack_buffer.get()), offsets.total_bitunpack_count,
	               offsets.bitunpack_start_row, width);
	auto delta_decode_buffer = unique_ptr<uint32_t[]>(new uint32_t[offsets.total_delta_decode_count]);
	DeltaDecodeIndices(bitunpack_buffer.get() + offsets.bitunpack_alignment_offset, delta_decode_buffer.get(),
	                   offsets.total_delta_decode_count, 0);

	uint32_t string_length = bitunpack_buffer[offsets.scan_offset];

	string_t compressed_string = UncompressedStringStorage::FetchStringFromDict(
	    segment, dict.end, result, base_ptr,
	    UnsafeNumericCast<int32_t>(delta_decode_buffer[offsets.unused_delta_decoded_values]), string_length);

	auto &str_buffer = StringVector::GetStringBuffer(result);
	result_data[result_idx] = FSSTPrimitives::DecompressValue((void *)&decoder, str_buffer, compressed_string.GetData(),
	                                                          compressed_string.GetSize());
}